

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFxu.c
# Opt level: O2

void Abc_NtkFxuFreeInfo(Fxu_Data_t *p)

{
  void *__ptr;
  Vec_Ptr_t *pVVar1;
  long lVar2;
  
  pVVar1 = p->vFaninsNew;
  if (pVVar1 != (Vec_Ptr_t *)0x0) {
    for (lVar2 = 0; lVar2 < pVVar1->nSize; lVar2 = lVar2 + 1) {
      __ptr = pVVar1->pArray[lVar2];
      if (__ptr != (void *)0x0) {
        free(*(void **)((long)__ptr + 8));
        free(__ptr);
        pVVar1 = p->vFaninsNew;
      }
    }
  }
  if (p->vSops != (Vec_Ptr_t *)0x0) {
    Vec_PtrFree(p->vSops);
  }
  if (p->vSopsNew != (Vec_Ptr_t *)0x0) {
    Vec_PtrFree(p->vSopsNew);
  }
  if (p->vFanins != (Vec_Ptr_t *)0x0) {
    Vec_PtrFree(p->vFanins);
  }
  if (p->vFaninsNew != (Vec_Ptr_t *)0x0) {
    Vec_PtrFree(p->vFaninsNew);
    return;
  }
  return;
}

Assistant:

void Abc_NtkFxuFreeInfo( Fxu_Data_t * p )
{
    int i;
    // free the arrays of new fanins
    if ( p->vFaninsNew )
        for ( i = 0; i < p->vFaninsNew->nSize; i++ )
            if ( p->vFaninsNew->pArray[i] )
                Vec_IntFree( (Vec_Int_t *)p->vFaninsNew->pArray[i] );
    // free the arrays
    if ( p->vSops      ) Vec_PtrFree( p->vSops      );
    if ( p->vSopsNew   ) Vec_PtrFree( p->vSopsNew   );
    if ( p->vFanins    ) Vec_PtrFree( p->vFanins    );
    if ( p->vFaninsNew ) Vec_PtrFree( p->vFaninsNew );
//    ABC_FREE( p );
}